

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall
cli::Parser::CmdBase::CmdBase
          (CmdBase *this,string *name,string *alternative,string *description,bool required)

{
  long lVar1;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_51;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  byte local_40;
  allocator local_3f;
  byte local_3e;
  allocator local_3d [20];
  byte local_29;
  string *psStack_28;
  bool required_local;
  string *description_local;
  string *alternative_local;
  string *name_local;
  CmdBase *this_local;
  
  this->_vptr_CmdBase = (_func_int **)&PTR__CmdBase_001cd908;
  local_29 = required;
  psStack_28 = description;
  description_local = alternative;
  alternative_local = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  lVar1 = std::__cxx11::string::size();
  local_3e = 0;
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    local_3e = 1;
    std::__cxx11::string::string((string *)&this->command,"",local_3d);
  }
  else {
    std::operator+((char *)&this->command,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1af143);
  }
  if ((local_3e & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_3d);
  }
  lVar1 = std::__cxx11::string::size();
  local_40 = 0;
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    local_40 = 1;
    std::__cxx11::string::string((string *)&this->alternative,"",&local_3f);
  }
  else {
    std::operator+((char *)&this->alternative,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"--");
  }
  if ((local_40 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_3f);
  }
  std::__cxx11::string::string((string *)&this->description,(string *)psStack_28);
  this->required = (bool)(local_29 & 1);
  this->handled = false;
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(&local_50);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_51);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->arguments,local_50,&local_51);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_51);
  return;
}

Assistant:

explicit CmdBase(const std::string& name, const std::string& alternative, const std::string& description, bool required) : 
				name(name),
				command(name.size() > 0 ? "-" + name : ""),
				alternative(alternative.size() > 0 ? "--" + alternative : ""),
				description(description),
				required(required),
				handled(false),
				arguments({}) {
			}